

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O3

base_learner * baseline_setup(options_i *options,vw *all)

{
  undefined4 uVar1;
  options_i *options_00;
  undefined8 uVar2;
  int iVar3;
  baseline *__ptr;
  _func_int ***ppp_Var4;
  option_group_definition *poVar5;
  example *peVar6;
  base_learner *l;
  single_learner *__src;
  learner<baseline,_example> *__dest;
  bool baseline_option;
  size_type __dnew_4;
  option_group_definition new_options;
  string loss_function;
  string loss_function_type;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  bool local_439;
  _func_int ***local_438;
  _func_int **local_430;
  _func_int **local_428 [2];
  options_i *local_418;
  long local_410;
  _func_int ***local_408;
  _func_int **local_400;
  _func_int **local_3f8 [2];
  _func_int ***local_3e8;
  _func_int **local_3e0;
  _func_int **local_3d8 [2];
  _func_int ***local_3c8;
  _func_int **local_3c0;
  _func_int **local_3b8 [2];
  string local_3a8;
  string local_388;
  string local_368;
  option_group_definition local_348;
  long *local_310;
  long local_308;
  long local_300 [2];
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined1 local_2e0 [16];
  string local_2d0;
  undefined1 local_2b0 [112];
  bool local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [112];
  bool local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  __ptr = calloc_or_throw<baseline>(1);
  __ptr->ec = (example *)0x0;
  __ptr->all = (vw *)0x0;
  __ptr->lr_scaling = false;
  *(undefined3 *)&__ptr->field_0x11 = 0;
  __ptr->lr_multiplier = 0.0;
  __ptr->global_only = false;
  __ptr->global_initialized = false;
  __ptr->check_enabled = false;
  *(undefined5 *)&__ptr->field_0x1b = 0;
  local_439 = false;
  local_2f0 = local_2e0;
  local_2e8 = 0;
  local_2e0[0] = 0;
  local_2b0._0_8_ = (_func_int **)0x10;
  local_438 = local_428;
  local_438 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_438,(ulong)local_2b0);
  local_428[0] = (_func_int **)local_2b0._0_8_;
  *(undefined4 *)local_438 = 0x65736142;
  builtin_strncpy((char *)((long)local_438 + 4),"line",4);
  *(undefined4 *)(local_438 + 1) = 0x74706f20;
  builtin_strncpy((char *)((long)local_438 + 0xc),"ions",4);
  local_430 = (_func_int **)local_2b0._0_8_;
  *(char *)((long)local_438 + local_2b0._0_8_) = '\0';
  local_348.m_name._M_dataplus._M_p = (pointer)&local_348.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,local_438,(char *)(local_2b0._0_8_ + (long)local_438));
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368.field_2._M_allocated_capacity = 0x656e696c65736162;
  local_368._M_string_length = 8;
  local_368.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_368,&local_439);
  local_240 = true;
  local_3c8 = local_3b8;
  local_d0._0_8_ = (_func_int **)0x5c;
  ppp_Var4 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3c8,(ulong)local_d0);
  uVar2 = local_d0._0_8_;
  local_3b8[0] = (_func_int **)local_d0._0_8_;
  local_3c8 = ppp_Var4;
  memcpy(ppp_Var4,
         "Learn an additive baseline (from constant features) and a residual separately in regression."
         ,0x5c);
  local_3c0 = (_func_int **)uVar2;
  *(undefined1 *)((long)ppp_Var4 + uVar2) = 0;
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_348,(typed_option<bool> *)local_2b0);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388.field_2._M_allocated_capacity._0_5_ = 0x756d5f726c;
  local_388.field_2._M_allocated_capacity._5_3_ = 0x69746c;
  local_388.field_2._8_5_ = 0x7265696c70;
  local_388._M_string_length = 0xd;
  local_388.field_2._M_local_buf[0xd] = '\0';
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_d0,&local_388,&__ptr->lr_multiplier);
  local_3e8 = local_3d8;
  local_170._0_8_ = (_func_int **)0x2b;
  local_3e8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3e8,(ulong)local_170);
  local_3d8[0] = (_func_int **)local_170._0_8_;
  builtin_strncpy((char *)((long)local_3e8 + 0x1b),"r baseli",8);
  builtin_strncpy((char *)((long)local_3e8 + 0x23),"ne model",8);
  local_3e8[2] = (_func_int **)0x7265696c7069746c;
  local_3e8[3] = (_func_int **)0x73616220726f6620;
  *local_3e8 = (_func_int **)0x676e696e7261656c;
  local_3e8[1] = (_func_int **)0x756d206574617220;
  local_3e0 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_3e8 + local_170._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar5,(typed_option<float> *)local_d0);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  local_3a8.field_2._M_allocated_capacity._0_7_ = 0x5f6c61626f6c67;
  local_3a8.field_2._7_4_ = 0x796c6e6f;
  local_3a8._M_string_length = 0xb;
  local_3a8.field_2._M_local_buf[0xb] = '\0';
  local_418 = options;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_3a8,&__ptr->global_only);
  local_100 = true;
  local_408 = local_3f8;
  local_210._0_8_ = (_func_int **)0x47;
  ppp_Var4 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_408,(ulong)local_210);
  uVar2 = local_210._0_8_;
  local_3f8[0] = (_func_int **)local_210._0_8_;
  local_408 = ppp_Var4;
  memcpy(ppp_Var4,"use separate example with only global constant for baseline predictions",0x47);
  local_400 = (_func_int **)uVar2;
  *(undefined1 *)((long)ppp_Var4 + uVar2) = 0;
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_170);
  local_2d0.field_2._M_allocated_capacity._0_5_ = 0x6b63656863;
  local_2d0.field_2._M_allocated_capacity._5_3_ = 0x6e655f;
  local_2d0.field_2._8_5_ = 0x64656c6261;
  local_2d0._M_string_length = 0xd;
  local_2d0.field_2._M_local_buf[0xd] = '\0';
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_2d0,&__ptr->check_enabled);
  local_1a0 = true;
  local_410 = 0x38;
  local_310 = local_300;
  local_310 = (long *)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_410);
  local_300[0] = local_410;
  local_310[4] = 0x61746e6f6320656c;
  local_310[5] = 0x62616e6520736e69;
  local_310[2] = 0x74206e6568772065;
  local_310[3] = 0x706d617865206568;
  *local_310 = 0x65737520796c6e6f;
  local_310[1] = 0x6e696c6573616220;
  local_310[6] = 0x67616c662064656c;
  local_308 = local_410;
  *(char *)((long)local_310 + local_410) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar5,(typed_option<bool> *)local_210);
  if (local_310 != local_300) {
    operator_delete(local_310);
  }
  local_210._0_8_ = &PTR__typed_option_00308c78;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  options_00 = local_418;
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if (local_408 != local_3f8) {
    operator_delete(local_408);
  }
  local_170._0_8_ = &PTR__typed_option_00308c78;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_3e8 != local_3d8) {
    operator_delete(local_3e8);
  }
  local_d0._0_8_ = &PTR__typed_option_003086f0;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8);
  }
  local_2b0._0_8_ = &PTR__typed_option_00308c78;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_348);
  if (local_439 == false) {
    __dest = (learner<baseline,_example> *)0x0;
  }
  else {
    peVar6 = VW::alloc_examples(simple_label.label_size,1);
    __ptr->ec = peVar6;
    peVar6->in_use = true;
    __ptr->all = all;
    (**all->loss->_vptr_loss_function)(local_2b0);
    iVar3 = std::__cxx11::string::compare(local_2b0);
    if (iVar3 != 0) {
      __ptr->lr_scaling = true;
    }
    l = setup_base(options_00,all);
    __src = LEARNER::as_singleline<char,char>(l);
    uVar1 = *(undefined4 *)(__src + 0xd0);
    __dest = calloc_or_throw<LEARNER::learner<baseline,example>>(1);
    memcpy(__dest,__src,0xe9);
    *(single_learner **)(__dest + 0x20) = __src;
    *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
    *(baseline **)(__dest + 0xb8) = __ptr;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = LEARNER::noop;
    *(undefined8 *)(__dest + 0xd8) = 1;
    *(undefined8 *)(__dest + 0xe0) = *(undefined8 *)(__src + 0xe0);
    *(baseline **)(__dest + 0x18) = __ptr;
    *(code **)(__dest + 0x28) = predict_or_learn<true>;
    *(code **)(__dest + 0x38) = predict_or_learn<true>;
    *(code **)(__dest + 0x30) = predict_or_learn<false>;
    *(undefined8 *)(__dest + 0x40) = 0;
    *(undefined4 *)(__dest + 0xd0) = uVar1;
    __dest[0xe8] = (learner<baseline,_example>)0x0;
    *(baseline **)(__dest + 0x48) = __ptr;
    *(code **)(__dest + 0x50) = sensitivity;
    *(baseline **)(__dest + 0xb8) = __ptr;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = finish;
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_);
    }
    __ptr = (baseline *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_348.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
    operator_delete(local_348.m_name._M_dataplus._M_p);
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0);
  }
  if (__ptr != (baseline *)0x0) {
    free(__ptr);
  }
  return (base_learner *)__dest;
}

Assistant:

base_learner* baseline_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<baseline>();
  bool baseline_option = false;
  std::string loss_function;

  option_group_definition new_options("Baseline options");
  new_options
      .add(make_option("baseline", baseline_option)
               .keep()
               .help("Learn an additive baseline (from constant features) and a residual separately in regression."))
      .add(make_option("lr_multiplier", data->lr_multiplier).help("learning rate multiplier for baseline model"))
      .add(make_option("global_only", data->global_only)
               .keep()
               .help("use separate example with only global constant for baseline predictions"))
      .add(make_option("check_enabled", data->check_enabled)
               .keep()
               .help("only use baseline when the example contains enabled flag"));
  options.add_and_parse(new_options);

  if (!baseline_option)
    return nullptr;

  // initialize baseline example
  data->ec = VW::alloc_examples(simple_label.label_size, 1);
  data->ec->in_use = true;
  data->all = &all;

  auto loss_function_type = all.loss->getType();
  if (loss_function_type != "logistic")
    data->lr_scaling = true;

  auto base = as_singleline(setup_base(options, all));

  learner<baseline, example>& l = init_learner(data, base, predict_or_learn<true>, predict_or_learn<false>);

  l.set_sensitivity(sensitivity);
  l.set_finish(finish);

  return make_base(l);
}